

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O3

_Bool av1_resize_vert_dir_c
                (uint8_t *intbuf,uint8_t *output,int out_stride,int height,int height2,int width2,
                int start_col)

{
  uint8_t *input;
  uint8_t *output_00;
  uint8_t *puVar1;
  long lVar2;
  long lVar3;
  
  input = (uint8_t *)aom_malloc((long)height);
  output_00 = (uint8_t *)aom_malloc((long)height2);
  if (start_col < width2 && (output_00 != (uint8_t *)0x0 && input != (uint8_t *)0x0)) {
    lVar3 = (long)start_col;
    do {
      if (0 < height) {
        puVar1 = intbuf + lVar3;
        lVar2 = 0;
        do {
          input[lVar2] = *puVar1;
          puVar1 = puVar1 + width2;
          lVar2 = lVar2 + 1;
        } while (height != (int)lVar2);
      }
      down2_symeven(input,height,output_00,0);
      if (0 < height2) {
        puVar1 = output + lVar3;
        lVar2 = 0;
        do {
          *puVar1 = output_00[lVar2];
          puVar1 = puVar1 + out_stride;
          lVar2 = lVar2 + 1;
        } while (height2 != (int)lVar2);
      }
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != width2);
  }
  aom_free(input);
  aom_free(output_00);
  return output_00 != (uint8_t *)0x0 && input != (uint8_t *)0x0;
}

Assistant:

bool av1_resize_vert_dir_c(uint8_t *intbuf, uint8_t *output, int out_stride,
                           int height, int height2, int width2, int start_col) {
  bool mem_status = true;
  uint8_t *arrbuf = (uint8_t *)aom_malloc(sizeof(*arrbuf) * height);
  uint8_t *arrbuf2 = (uint8_t *)aom_malloc(sizeof(*arrbuf2) * height2);
  if (arrbuf == NULL || arrbuf2 == NULL) {
    mem_status = false;
    goto Error;
  }

  for (int i = start_col; i < width2; ++i) {
    fill_col_to_arr(intbuf + i, width2, height, arrbuf);
    down2_symeven(arrbuf, height, arrbuf2, 0);
    fill_arr_to_col(output + i, out_stride, height2, arrbuf2);
  }

Error:
  aom_free(arrbuf);
  aom_free(arrbuf2);
  return mem_status;
}